

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int parse_value(frozen *f)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  json_type t;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  char *s;
  bool bVar10;
  
  pbVar8 = (byte *)f->end;
  pbVar9 = (byte *)f->cur;
  if (pbVar9 < pbVar8) {
    do {
      if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) break;
      pbVar9 = pbVar9 + 1;
      f->cur = (char *)pbVar9;
    } while (pbVar9 != pbVar8);
  }
  if (pbVar8 <= pbVar9) {
    return -2;
  }
  bVar1 = *pbVar9;
  if (0x5a < bVar1) {
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x5b) {
        iVar3 = test_and_skip(f,0x5b);
        if (iVar3 < 0) {
          return iVar3;
        }
        iVar3 = capture_ptr(f,f->cur + -1,JSON_TYPE_ARRAY);
        if (iVar3 < 0) {
          return iVar3;
        }
        iVar3 = f->num_tokens;
        pbVar8 = (byte *)f->end;
        pbVar9 = (byte *)f->cur;
        do {
          if (pbVar9 < pbVar8) {
            do {
              if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0))
              break;
              pbVar9 = pbVar9 + 1;
              f->cur = (char *)pbVar9;
            } while (pbVar9 != pbVar8);
          }
          if ((pbVar9 < pbVar8) && (*pbVar9 == 0x5d)) {
            iVar4 = test_and_skip(f,0x5d);
            if (iVar4 < 0) {
              return iVar4;
            }
            pbVar8 = (byte *)f->cur;
            goto LAB_00112801;
          }
          iVar4 = parse_value(f);
          if (iVar4 < 0) {
            return iVar4;
          }
          pbVar8 = (byte *)f->end;
          pbVar9 = (byte *)f->cur;
          if (pbVar9 < pbVar8) {
            do {
              if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0))
              break;
              pbVar9 = pbVar9 + 1;
              f->cur = (char *)pbVar9;
            } while (pbVar9 != pbVar8);
          }
          if ((pbVar9 < pbVar8) && (*pbVar9 == 0x2c)) {
            pbVar9 = pbVar9 + 1;
            f->cur = (char *)pbVar9;
          }
        } while( true );
      }
      if (bVar1 != 0x66) {
        return -1;
      }
      s = "false";
      iVar3 = 5;
      t = JSON_TYPE_FALSE;
    }
    else if (bVar1 == 0x6e) {
      s = "null";
      iVar3 = 4;
      t = JSON_TYPE_NULL;
    }
    else {
      if (bVar1 != 0x74) {
        if (bVar1 != 0x7b) {
          return -1;
        }
        iVar3 = parse_object(f);
        goto LAB_0011273d;
      }
      s = "true";
      iVar3 = 4;
      t = JSON_TYPE_TRUE;
    }
    iVar3 = expect(f,s,iVar3,t);
LAB_0011273d:
    if (-1 < iVar3) {
      return 0;
    }
    return iVar3;
  }
  if (9 < bVar1 - 0x30) {
    if (bVar1 == 0x22) {
      iVar3 = parse_string(f);
      goto LAB_0011273d;
    }
    if (bVar1 != 0x2d) {
      return -1;
    }
  }
  do {
    if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) break;
    pbVar9 = pbVar9 + 1;
    f->cur = (char *)pbVar9;
  } while (pbVar9 != pbVar8);
  if (pbVar9 < pbVar8) {
    bVar1 = *pbVar9;
    iVar3 = capture_ptr(f,(char *)pbVar9,JSON_TYPE_NUMBER);
    if (iVar3 < 0) {
      return iVar3;
    }
    pbVar9 = (byte *)f->cur;
    if (bVar1 == 0x2d) {
      pbVar9 = pbVar9 + 1;
      f->cur = (char *)pbVar9;
    }
  }
  else {
    iVar3 = capture_ptr(f,(char *)pbVar9,JSON_TYPE_NUMBER);
    if (iVar3 < 0) {
      return iVar3;
    }
    pbVar9 = (byte *)f->cur;
  }
  pbVar2 = (byte *)f->end;
  if (pbVar2 <= pbVar9) {
    return -2;
  }
  if ((int)(char)*pbVar9 - 0x3aU < 0xfffffff6) {
    return -1;
  }
  pbVar7 = pbVar2 + ~(ulong)pbVar9;
  do {
    pbVar6 = pbVar9 + 1;
    if ((int)(char)*pbVar9 - 0x3aU < 0xfffffff6) {
      pbVar8 = pbVar9;
      if (*pbVar9 == 0x2e) {
        f->cur = (char *)pbVar6;
        if (pbVar2 <= pbVar6) {
          return -2;
        }
        if ((int)(char)*pbVar6 - 0x3aU < 0xfffffff6) {
          return -1;
        }
        pbVar7 = pbVar7 + (long)pbVar6;
        goto LAB_00112771;
      }
      break;
    }
    f->cur = (char *)pbVar6;
    bVar10 = pbVar7 != (byte *)0x0;
    pbVar7 = pbVar7 + -1;
    pbVar8 = pbVar2;
    pbVar9 = pbVar6;
  } while (bVar10);
  goto LAB_00112790;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    f->cur = (char *)pbVar6;
    pbVar8 = pbVar7;
    if (pbVar6 == pbVar2) break;
LAB_00112771:
    pbVar8 = pbVar6;
    if ((int)(char)*pbVar6 - 0x3aU < 0xfffffff6) break;
  }
LAB_00112790:
  if ((pbVar8 < pbVar2) && ((*pbVar8 | 0x20) == 0x65)) {
    pbVar9 = pbVar8 + 1;
    f->cur = (char *)pbVar9;
    if (pbVar2 <= pbVar9) {
      return -2;
    }
    if ((*pbVar9 == 0x2d) || (*pbVar9 == 0x2b)) {
      f->cur = (char *)(pbVar8 + 2);
      pbVar9 = pbVar8 + 2;
    }
    pbVar8 = pbVar9;
    if (pbVar2 <= pbVar8) {
      return -2;
    }
    if ((int)(char)*pbVar8 - 0x3aU < 0xfffffff6) {
      return -1;
    }
    lVar5 = (long)pbVar2 - (long)pbVar8;
    do {
      if ((int)(char)*pbVar8 - 0x3aU < 0xfffffff6) break;
      pbVar8 = pbVar8 + 1;
      f->cur = (char *)pbVar8;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  iVar3 = f->num_tokens;
LAB_00112801:
  capture_len(f,iVar3 + -1,(char *)pbVar8);
  return 0;
}

Assistant:

static int parse_value(struct frozen *f) {
    int ch = cur(f);

    switch (ch) {
        case '"':
            TRY(parse_string(f));
            break;
        case '{':
            TRY(parse_object(f));
            break;
        case '[':
            TRY(parse_array(f));
            break;
        case 'n':
            TRY(expect(f, "null", 4, JSON_TYPE_NULL));
            break;
        case 't':
            TRY(expect(f, "true", 4, JSON_TYPE_TRUE));
            break;
        case 'f':
            TRY(expect(f, "false", 5, JSON_TYPE_FALSE));
            break;
        case '-':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
            TRY(parse_number(f));
            break;
        default:
            return ch == END_OF_STRING ? JSON_STRING_INCOMPLETE : JSON_STRING_INVALID;
    }

    return 0;
}